

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAlloc.cpp
# Opt level: O0

void __thiscall glslang::TPoolAllocator::pop(TPoolAllocator *this)

{
  tHeader *ptVar1;
  tHeader *ptVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  size_t pageCount;
  tHeader *nextInUse;
  tHeader *page;
  TPoolAllocator *this_local;
  
  sVar4 = std::
          vector<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
          ::size(&this->stack);
  if (sVar4 != 0) {
    pvVar5 = std::
             vector<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
             ::back(&this->stack);
    ptVar1 = pvVar5->page;
    pvVar5 = std::
             vector<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
             ::back(&this->stack);
    this->currentPageOffset = pvVar5->offset;
    while (this->inUseList != ptVar1) {
      ptVar2 = this->inUseList->nextPage;
      uVar3 = this->inUseList->pageCount;
      tHeader::~tHeader(this->inUseList);
      if (uVar3 < 2) {
        this->inUseList->nextPage = this->freeList;
        this->freeList = this->inUseList;
      }
      else if (this->inUseList != (tHeader *)0x0) {
        operator_delete__(this->inUseList);
      }
      this->inUseList = ptVar2;
    }
    std::
    vector<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
    ::pop_back(&this->stack);
  }
  return;
}

Assistant:

void TPoolAllocator::pop()
{
    if (stack.size() < 1)
        return;

    tHeader* page = stack.back().page;
    currentPageOffset = stack.back().offset;

    while (inUseList != page) {
        tHeader* nextInUse = inUseList->nextPage;
        size_t pageCount = inUseList->pageCount;

        // This technically ends the lifetime of the header as C++ object,
        // but we will still control the memory and reuse it.
        inUseList->~tHeader(); // currently, just a debug allocation checker

        if (pageCount > 1) {
            delete [] reinterpret_cast<char*>(inUseList);
        } else {
            inUseList->nextPage = freeList;
            freeList = inUseList;
        }
        inUseList = nextInUse;
    }

    stack.pop_back();
}